

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O1

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::thread::id,int>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::thread::id,void>,std::equal_to<std::thread::id>,std::allocator<std::pair<std::thread::id_const,int>>>
::nosize_unchecked_emplace_at<std::pair<std::thread::id&&,int&&>>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_map_types<std::thread::id,int>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::thread::id,void>,std::equal_to<std::thread::id>,std::allocator<std::pair<std::thread::id_const,int>>>
          *this,arrays_type *arrays_,size_t pos0,size_t hash,pair<std::thread::id_&&,_int_&&> *args)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  group_type_pointer pgVar3;
  value_type_pointer ppVar4;
  id *piVar5;
  int *piVar6;
  uint uVar7;
  ushort uVar8;
  ulong uVar9;
  group_type_pointer pgVar10;
  pair<const_std::thread::id,_int> *ppVar11;
  long lVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  
  pgVar3 = arrays_->groups_;
  ppVar4 = arrays_->elements_;
  pgVar10 = __return_storage_ptr__->pg;
  piVar5 = args->first;
  piVar6 = args->second;
  uVar13 = (ulong)__return_storage_ptr__->n;
  ppVar11 = __return_storage_ptr__->p;
  lVar12 = 1;
  while( true ) {
    pgVar1 = pgVar3 + pos0;
    pgVar2 = pgVar3 + pos0;
    auVar14[0] = -(pgVar2->m[0].n == '\0');
    auVar14[1] = -(pgVar2->m[1].n == '\0');
    auVar14[2] = -(pgVar2->m[2].n == '\0');
    auVar14[3] = -(pgVar2->m[3].n == '\0');
    auVar14[4] = -(pgVar2->m[4].n == '\0');
    auVar14[5] = -(pgVar2->m[5].n == '\0');
    auVar14[6] = -(pgVar2->m[6].n == '\0');
    auVar14[7] = -(pgVar2->m[7].n == '\0');
    auVar14[8] = -(pgVar2->m[8].n == '\0');
    auVar14[9] = -(pgVar2->m[9].n == '\0');
    auVar14[10] = -(pgVar2->m[10].n == '\0');
    auVar14[0xb] = -(pgVar2->m[0xb].n == '\0');
    auVar14[0xc] = -(pgVar2->m[0xc].n == '\0');
    auVar14[0xd] = -(pgVar2->m[0xd].n == '\0');
    auVar14[0xe] = -(pgVar2->m[0xe].n == '\0');
    auVar14[0xf] = -(pgVar2->m[0xf].n == '\0');
    uVar8 = (ushort)(SUB161(auVar14 >> 7,0) & 1) | (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe;
    if (uVar8 == 0) {
      pgVar1->m[0xf].n = pgVar1->m[0xf].n | '\x01' << ((byte)hash & 7);
    }
    else {
      uVar7 = 0;
      if (uVar8 != 0) {
        for (; (uVar8 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
        }
      }
      uVar13 = (ulong)uVar7;
      uVar9 = (ulong)(uVar7 << 4);
      ppVar11 = (pair<const_std::thread::id,_int> *)
                ((long)&ppVar4[pos0 * 0xf].first._M_thread + uVar9);
      *(native_handle_type *)((long)&ppVar4[pos0 * 0xf].first._M_thread + uVar9) = piVar5->_M_thread
      ;
      *(int *)((long)&ppVar4[pos0 * 0xf].second + uVar9) = *piVar6;
      pgVar1->m[uVar13].n =
           *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::
                       match_word(unsigned_long)::word + (hash & 0xff));
      pgVar10 = pgVar1;
    }
    if (uVar8 != 0) break;
    pos0 = pos0 + lVar12 & arrays_->groups_size_mask;
    lVar12 = lVar12 + 1;
  }
  __return_storage_ptr__->n = (uint)uVar13;
  __return_storage_ptr__->p = ppVar11;
  __return_storage_ptr__->pg = pgVar10;
  return __return_storage_ptr__;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }